

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

ssize_t __thiscall QMakeProject::read(QMakeProject *this,int __fd,void *__buf,size_t __nbytes)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  VisitReturn vr;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_b8;
  QDir local_a0 [8];
  QArrayDataPointer<char16_t> local_98;
  QLatin1StringView local_78;
  QLatin1String local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(&this->m_projectFile,(QString *)CONCAT44(in_register_00000034,__fd));
  QString::operator=(&(this->super_QMakeEvaluator).m_outputDir,(QString *)&Option::output_dir);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(&local_68,"-");
  bVar4 = operator==((QString *)CONCAT44(in_register_00000034,__fd),&local_68);
  if (bVar4) {
    QLatin1String::QLatin1String(&local_78,"(stdin)");
    QString::QString((QString *)&local_58,local_78);
  }
  else {
    qmake_getpwd();
    QDir::QDir(local_a0,(QString *)&QStack_b8);
    QDir::absoluteFilePath((QString *)&local_98);
    QDir::cleanPath((QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QDir::~QDir(local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_b8);
  }
  QFileInfo::QFileInfo((QFileInfo *)&QStack_b8,(QString *)&local_58);
  QFileInfo::path();
  pDVar2 = (this->m_projectDir).d.d;
  pcVar3 = (this->m_projectDir).d.ptr;
  (this->m_projectDir).d.d = local_98.d;
  (this->m_projectDir).d.ptr = local_98.ptr;
  qVar1 = (this->m_projectDir).d.size;
  (this->m_projectDir).d.size = local_98.size;
  local_98.d = pDVar2;
  local_98.ptr = pcVar3;
  local_98.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QFileInfo::~QFileInfo((QFileInfo *)&QStack_b8);
  vr = QMakeEvaluator::evaluateFile
                 (&this->super_QMakeEvaluator,(QString *)&local_58,EvalProjectFile,
                  (QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>)SUB84(__buf,0));
  bVar4 = boolRet(vr);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return CONCAT71(extraout_var,bVar4) & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeProject::read(const QString &project, LoadFlags what)
{
    m_projectFile = project;
    setOutputDir(Option::output_dir);
    QString absproj = (project == QLatin1String("-"))
            ? QLatin1String("(stdin)")
            : QDir::cleanPath(QDir(qmake_getpwd()).absoluteFilePath(project));
    m_projectDir = QFileInfo(absproj).path();
    return boolRet(evaluateFile(absproj, QMakeHandler::EvalProjectFile, what));
}